

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileHelpers.cpp
# Opt level: O2

bool helics::fileops::looksLikeFile(string_view configString)

{
  bool bVar1;
  size_type sVar2;
  char *in_RDX;
  char *extraout_RDX;
  fileops *this;
  bool bVar3;
  string_view tomlString;
  string_view jsonString;
  string_view configString_local;
  
  tomlString._M_len = configString._M_str;
  this = (fileops *)configString._M_len;
  tomlString._M_str = in_RDX;
  configString_local._M_len = (size_t)this;
  configString_local._M_str = tomlString._M_len;
  bVar1 = hasTomlExtension(this,tomlString);
  bVar3 = true;
  if (!bVar1) {
    jsonString._M_str = extraout_RDX;
    jsonString._M_len = (size_t)tomlString._M_len;
    bVar1 = hasJsonExtension(this,jsonString);
    if (!bVar1) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&configString_local,'{',0)
      ;
      bVar3 = sVar2 != 0xffffffffffffffff;
    }
  }
  return bVar3;
}

Assistant:

bool looksLikeFile(std::string_view configString)
{
    if (helics::fileops::hasTomlExtension(configString)) {
        return true;
    }
    if ((helics::fileops::hasJsonExtension(configString)) ||
        (configString.find_first_of('{') != std::string_view::npos)) {
        return true;
    }
    return false;
}